

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O1

void __thiscall getRands::getRands(getRands *this,rd_option rndopt,int rand_vec_size,int rand_seed)

{
  pointer pfVar1;
  ulong uVar2;
  long lVar3;
  undefined8 extraout_RAX;
  getRands *this_00;
  value_type_conflict local_24;
  
  this->buf_ = (OASIS_FLOAT *)0x0;
  this_00 = (getRands *)0x0;
  uVar2 = time((time_t *)0x0);
  uVar2 = uVar2 & 0xffffffff;
  (this->gen_)._M_x[0] = uVar2;
  lVar3 = 4;
  do {
    uVar2 = (ulong)((((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3) - 3);
    (this->gen_)._M_x[lVar3 + -3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x273);
  (this->gen_)._M_p = 0x270;
  (this->dis_)._M_param._M_a = 0.0;
  (this->dis_)._M_param._M_b = 1.0;
  this->rand_vec_size_ = rand_vec_size;
  this->rand_seed_ = rand_seed;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < rand_seed) {
    uVar2 = (ulong)(uint)rand_seed;
    (this->gen_)._M_x[0] = uVar2;
    lVar3 = 4;
    do {
      uVar2 = (ulong)((((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3) - 3);
      (this->gen_)._M_x[lVar3 + -3] = uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x273);
    (this->gen_)._M_p = 0x270;
  }
  this->rndopt_ = rndopt;
  this->base_offset_ = 0;
  if (rndopt == usecachedvector) {
    std::vector<float,_std::allocator<float>_>::resize(&this->rnd_,(long)rand_vec_size,&local_24);
  }
  else if (rndopt != usehashedseed) {
    if (rndopt != userandomnumberfile) {
      getRands(this_00);
      pfVar1 = (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pfVar1 != (pointer)0x0) {
        operator_delete(pfVar1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    userandfile(this);
  }
  return;
}

Assistant:

getRands::getRands(rd_option rndopt, int rand_vec_size,int rand_seed) : gen_(time(0)), dis_(0, 1), rand_vec_size_(rand_vec_size), rand_seed_(rand_seed)
{
	if (rand_seed_ > 0) gen_.seed(rand_seed_);

	rndopt_ = rndopt;

	base_offset_ = 0;
	switch (rndopt_) {
		case rd_option::userandomnumberfile:
			userandfile();
		break;
		case rd_option::usecachedvector:
			rnd_.resize(rand_vec_size, -1);
		break;
		case rd_option::usehashedseed:
			// nothing to do
			break;
		default:
			fprintf(stderr, "FATAL: %s: Unknow random number option\n", __func__);
			exit(-1);
	}
	
}